

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O1

DdNode * Ivy_FraigNodesAreEquivBdd_int(DdManager *dd,DdNode *bFunc,Vec_Ptr_t *vFront,int Level)

{
  uint *puVar1;
  undefined8 uVar2;
  long lVar3;
  void **ppvVar4;
  uint uVar5;
  int iVar6;
  uint *__ptr;
  void *pvVar7;
  void *pvVar8;
  DdNode **vector;
  DdNode *pDVar9;
  DdNode *pDVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 100;
  __ptr[1] = 0;
  pvVar7 = malloc(800);
  *(void **)(__ptr + 2) = pvVar7;
  if (0 < vFront->nSize) {
    lVar13 = 0;
    do {
      pvVar7 = vFront->pArray[lVar13];
      uVar5 = *(uint *)((long)pvVar7 + 8);
      if (uVar5 >> 0xb == Level) {
        uVar12 = *(ulong *)((long)pvVar7 + 0x10) & 0xfffffffffffffffe;
        if ((*(uint *)(uVar12 + 8) & 0x20) == 0) {
          *(uint *)(uVar12 + 8) = *(uint *)(uVar12 + 8) | 0x20;
          uVar5 = __ptr[1];
          *(uint *)(uVar12 + 4) = uVar5;
          uVar11 = *__ptr;
          if (uVar5 == uVar11) {
            if ((int)uVar11 < 0x10) {
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar8 = malloc(0x80);
              }
              else {
                pvVar8 = realloc(*(void **)(__ptr + 2),0x80);
              }
              uVar14 = 0x10;
            }
            else {
              uVar14 = uVar11 * 2;
              if ((int)uVar14 <= (int)uVar11) goto LAB_007e84e4;
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar8 = malloc((ulong)uVar11 << 4);
              }
              else {
                pvVar8 = realloc(*(void **)(__ptr + 2),(ulong)uVar11 << 4);
              }
            }
            *(void **)(__ptr + 2) = pvVar8;
            *__ptr = uVar14;
          }
LAB_007e84e4:
          __ptr[1] = uVar5 + 1;
          *(ulong *)(*(long *)(__ptr + 2) + (long)(int)uVar5 * 8) = uVar12;
        }
        pvVar7 = (void *)(*(ulong *)((long)pvVar7 + 0x18) & 0xfffffffffffffffe);
        uVar5 = *(uint *)((long)pvVar7 + 8);
        if ((uVar5 & 0x20) == 0) goto LAB_007e8507;
      }
      else {
LAB_007e8507:
        *(uint *)((long)pvVar7 + 8) = uVar5 | 0x20;
        uVar5 = __ptr[1];
        *(uint *)((long)pvVar7 + 4) = uVar5;
        uVar11 = *__ptr;
        if (uVar5 == uVar11) {
          if ((int)uVar11 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar8 = malloc(0x80);
            }
            else {
              pvVar8 = realloc(*(void **)(__ptr + 2),0x80);
            }
            uVar14 = 0x10;
          }
          else {
            uVar14 = uVar11 * 2;
            if ((int)uVar14 <= (int)uVar11) goto LAB_007e856f;
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar8 = malloc((ulong)uVar11 << 4);
            }
            else {
              pvVar8 = realloc(*(void **)(__ptr + 2),(ulong)uVar11 << 4);
            }
          }
          *(void **)(__ptr + 2) = pvVar8;
          *__ptr = uVar14;
        }
LAB_007e856f:
        __ptr[1] = uVar5 + 1;
        *(void **)(*(long *)(__ptr + 2) + (long)(int)uVar5 * 8) = pvVar7;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < vFront->nSize);
  }
  uVar5 = __ptr[1];
  uVar11 = dd->size;
  if (dd->size <= (int)uVar5) {
    uVar11 = uVar5;
  }
  vector = (DdNode **)malloc((long)(int)uVar11 << 3);
  iVar6 = vFront->nSize;
  if (0 < iVar6) {
    lVar13 = 0;
    do {
      pvVar7 = vFront->pArray[lVar13];
      if (*(uint *)((long)pvVar7 + 8) >> 0xb == Level) {
        pDVar9 = Cudd_bddIthVar(dd,*(int *)((*(ulong *)((long)pvVar7 + 0x10) & 0xfffffffffffffffe) +
                                           4));
        uVar2 = *(undefined8 *)((long)pvVar7 + 0x10);
        pDVar10 = Cudd_bddIthVar(dd,*(int *)((*(ulong *)((long)pvVar7 + 0x18) & 0xfffffffffffffffe)
                                            + 4));
        pDVar9 = Cudd_bddAnd(dd,(DdNode *)((ulong)((uint)uVar2 & 1) ^ (ulong)pDVar9),
                             (DdNode *)
                             ((ulong)((uint)*(undefined8 *)((long)pvVar7 + 0x18) & 1) ^
                             (ulong)pDVar10));
      }
      else {
        pDVar9 = Cudd_bddIthVar(dd,*(int *)((long)pvVar7 + 4));
      }
      vector[lVar13] = pDVar9;
      Cudd_Ref(pDVar9);
      lVar13 = lVar13 + 1;
      iVar6 = vFront->nSize;
    } while (lVar13 < iVar6);
  }
  if (uVar11 != dd->size) {
    __assert_fail("NewSize == dd->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                  ,0xaaa,
                  "DdNode *Ivy_FraigNodesAreEquivBdd_int(DdManager *, DdNode *, Vec_Ptr_t *, int)");
  }
  if (iVar6 < dd->size) {
    lVar13 = (long)iVar6;
    do {
      pDVar9 = Cudd_bddIthVar(dd,(int)lVar13);
      vector[lVar13] = pDVar9;
      Cudd_Ref(pDVar9);
      lVar13 = lVar13 + 1;
    } while (lVar13 < dd->size);
  }
  pDVar9 = Cudd_bddVectorCompose(dd,bFunc,vector);
  Cudd_Ref(pDVar9);
  if (0 < (int)uVar5) {
    lVar13 = *(long *)(__ptr + 2);
    uVar12 = 0;
    do {
      lVar3 = *(long *)(lVar13 + uVar12 * 8);
      puVar1 = (uint *)(lVar3 + 8);
      *puVar1 = *puVar1 & 0xffffffdf;
      *(undefined4 *)(lVar3 + 4) = 0;
      uVar12 = uVar12 + 1;
    } while (uVar5 != uVar12);
  }
  if (0 < dd->size) {
    lVar13 = 0;
    do {
      Cudd_RecursiveDeref(dd,vector[lVar13]);
      lVar13 = lVar13 + 1;
    } while (lVar13 < dd->size);
  }
  if (vector != (DdNode **)0x0) {
    free(vector);
  }
  if (vFront->pArray != (void **)0x0) {
    free(vFront->pArray);
    vFront->pArray = (void **)0x0;
  }
  uVar5 = __ptr[1];
  ppvVar4 = *(void ***)(__ptr + 2);
  vFront->nCap = __ptr[0];
  vFront->nSize = uVar5;
  vFront->pArray = ppvVar4;
  __ptr[0] = 0;
  __ptr[1] = 0;
  __ptr[2] = 0;
  __ptr[3] = 0;
  free(__ptr);
  Cudd_Deref(pDVar9);
  return pDVar9;
}

Assistant:

DdNode * Ivy_FraigNodesAreEquivBdd_int( DdManager * dd, DdNode * bFunc, Vec_Ptr_t * vFront, int Level )
{
    DdNode ** pFuncs;
    DdNode * bFuncNew;
    Vec_Ptr_t * vTemp;
    Ivy_Obj_t * pObj, * pFanin;
    int i, NewSize;
    // create new frontier
    vTemp = Vec_PtrAlloc( 100 );
    Vec_PtrForEachEntry( Ivy_Obj_t *, vFront, pObj, i )
    {
        if ( (int)pObj->Level != Level )
        {
            pObj->fMarkB = 1;
            pObj->TravId = Vec_PtrSize(vTemp);
            Vec_PtrPush( vTemp, pObj );
            continue;
        }

        pFanin = Ivy_ObjFanin0(pObj);
        if ( pFanin->fMarkB == 0 )
        {
            pFanin->fMarkB = 1;
            pFanin->TravId = Vec_PtrSize(vTemp);
            Vec_PtrPush( vTemp, pFanin );
        }

        pFanin = Ivy_ObjFanin1(pObj);
        if ( pFanin->fMarkB == 0 )
        {
            pFanin->fMarkB = 1;
            pFanin->TravId = Vec_PtrSize(vTemp);
            Vec_PtrPush( vTemp, pFanin );
        }
    }
    // collect the permutation
    NewSize = IVY_MAX(dd->size, Vec_PtrSize(vTemp));
    pFuncs = ABC_ALLOC( DdNode *, NewSize );
    Vec_PtrForEachEntry( Ivy_Obj_t *, vFront, pObj, i )
    {
        if ( (int)pObj->Level != Level )
            pFuncs[i] = Cudd_bddIthVar( dd, pObj->TravId );
        else
            pFuncs[i] = Cudd_bddAnd( dd, 
                Cudd_NotCond( Cudd_bddIthVar(dd, Ivy_ObjFanin0(pObj)->TravId), Ivy_ObjFaninC0(pObj) ),
                Cudd_NotCond( Cudd_bddIthVar(dd, Ivy_ObjFanin1(pObj)->TravId), Ivy_ObjFaninC1(pObj) ) );
        Cudd_Ref( pFuncs[i] );
    }
    // add the remaining vars
    assert( NewSize == dd->size );
    for ( i = Vec_PtrSize(vFront); i < dd->size; i++ )
    {
        pFuncs[i] = Cudd_bddIthVar( dd, i );
        Cudd_Ref( pFuncs[i] );
    }

    // create new
    bFuncNew = Cudd_bddVectorCompose( dd, bFunc, pFuncs ); Cudd_Ref( bFuncNew );
    // clean trav Id
    Vec_PtrForEachEntry( Ivy_Obj_t *, vTemp, pObj, i )
    {
        pObj->fMarkB = 0;
        pObj->TravId = 0;
    }
    // deref
    for ( i = 0; i < dd->size; i++ )
        Cudd_RecursiveDeref( dd, pFuncs[i] );
    ABC_FREE( pFuncs );

    ABC_FREE( vFront->pArray );
    *vFront = *vTemp;

    vTemp->nCap = vTemp->nSize = 0;
    vTemp->pArray = NULL;
    Vec_PtrFree( vTemp );

    Cudd_Deref( bFuncNew );
    return bFuncNew;
}